

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

ssl_connect_data * cf_ctx_new(Curl_easy *data,alpn_spec *alpn)

{
  ssl_connect_data *psVar1;
  void *pvVar2;
  
  psVar1 = (ssl_connect_data *)(*Curl_ccalloc)(1,0xc0);
  if (psVar1 != (ssl_connect_data *)0x0) {
    psVar1->alpn = (alpn_spec *)data;
    Curl_bufq_init2(&psVar1->earlydata,0x10000,1,2);
    pvVar2 = (*Curl_ccalloc)(1,Curl_ssl->sizeof_ssl_backend_data);
    psVar1->backend = pvVar2;
    if (pvVar2 != (void *)0x0) {
      return psVar1;
    }
    (*Curl_cfree)(psVar1);
  }
  return (ssl_connect_data *)0x0;
}

Assistant:

static struct ssl_connect_data *cf_ctx_new(struct Curl_easy *data,
                                           const struct alpn_spec *alpn)
{
  struct ssl_connect_data *ctx;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx)
    return NULL;

  ctx->alpn = alpn;
  Curl_bufq_init2(&ctx->earlydata, CURL_SSL_EARLY_MAX, 1, BUFQ_OPT_NO_SPARES);
  ctx->backend = calloc(1, Curl_ssl->sizeof_ssl_backend_data);
  if(!ctx->backend) {
    free(ctx);
    return NULL;
  }
  return ctx;
}